

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_test.cc
# Opt level: O1

void leveldb::BM_LogAndApply(int iters,int num_base_files)

{
  int iVar1;
  long *plVar2;
  undefined4 extraout_var;
  size_type *psVar3;
  uint extraout_EDX;
  uint extraout_EDX_00;
  uint uVar4;
  uint extraout_EDX_01;
  uint extraout_EDX_02;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 extraout_RDX_02;
  undefined8 uVar5;
  uint uVar6;
  undefined4 in_register_0000003c;
  pointer file;
  pair<std::_Rb_tree_iterator<std::pair<int,_unsigned_long>_>,_bool> pVar7;
  bool save_manifest;
  InternalKey limit;
  DB *db;
  InternalKey limit_1;
  Status s;
  string dbname;
  InternalKeyComparator cmp;
  Mutex mu;
  VersionEdit vbase;
  char buf [16];
  VersionSet vset;
  Options options;
  Options opts;
  undefined1 local_6a0 [40];
  string local_678;
  uint64_t local_658;
  DB local_650;
  ulong local_648;
  Env *local_640;
  string local_638;
  InternalKeyComparator local_618;
  undefined1 local_608 [32];
  pointer local_5e8;
  pointer local_5e0;
  undefined1 local_5d8 [8];
  _Alloc_hider local_5d0;
  undefined1 local_5c8 [40];
  Slice local_5a0;
  __native_type local_590 [4];
  undefined1 local_4e8 [24];
  stringstream local_4d0 [72];
  _Rb_tree<std::pair<int,unsigned_long>,std::pair<int,unsigned_long>,std::_Identity<std::pair<int,unsigned_long>>,std::less<std::pair<int,unsigned_long>>,std::allocator<std::pair<int,unsigned_long>>>
  local_488 [328];
  undefined1 local_340 [24];
  stringstream local_328 [568];
  Options local_f0;
  Options local_90;
  
  local_658 = CONCAT44(in_register_0000003c,iters);
  test::TmpDir_abi_cxx11_();
  plVar2 = (long *)std::__cxx11::string::append(local_340);
  local_638._M_dataplus._M_p = (pointer)*plVar2;
  psVar3 = (size_type *)(plVar2 + 2);
  if ((size_type *)local_638._M_dataplus._M_p == psVar3) {
    local_638.field_2._M_allocated_capacity = *psVar3;
    local_638.field_2._8_8_ = plVar2[3];
    local_638._M_dataplus._M_p = (pointer)&local_638.field_2;
  }
  else {
    local_638.field_2._M_allocated_capacity = *psVar3;
  }
  local_638._M_string_length = plVar2[1];
  *plVar2 = (long)psVar3;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  if ((undefined1 *)CONCAT71(local_340._1_7_,local_340[0]) != local_340 + 0x10) {
    operator_delete((undefined1 *)CONCAT71(local_340._1_7_,local_340[0]));
  }
  Options::Options((Options *)local_340);
  DestroyDB((leveldb *)&local_5d0,&local_638,(Options *)local_340);
  if ((pointer)local_5d0._M_p != (pointer)0x0) {
    operator_delete__(local_5d0._M_p);
  }
  local_6a0._32_8_ = (long *)0x0;
  Options::Options(&local_90);
  local_90.create_if_missing = true;
  DB::Open(&local_650,&local_90,&local_638,(DB **)(local_6a0 + 0x20));
  local_340[0] = true;
  local_340._8_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_test.cc";
  local_340._16_4_ = 0x8d5;
  std::__cxx11::stringstream::stringstream(local_328);
  test::Tester::IsOk((Tester *)local_340,(Status *)&local_650);
  test::Tester::~Tester((Tester *)local_340);
  local_340[0] = true;
  local_340._8_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_test.cc";
  local_340._16_4_ = 0x8d6;
  std::__cxx11::stringstream::stringstream(local_328);
  test::Tester::Is((Tester *)local_340,(long *)local_6a0._32_8_ != (long *)0x0,"db != nullptr");
  test::Tester::~Tester((Tester *)local_340);
  if ((long *)local_6a0._32_8_ != (long *)0x0) {
    (**(code **)(*(long *)local_6a0._32_8_ + 8))();
  }
  local_6a0._32_8_ = 0;
  local_640 = Env::Default();
  local_5c8._16_8_ = 0;
  local_5c8._24_8_ = (__pthread_internal_list *)0x0;
  local_5c8._0_8_ = 0;
  local_5c8._8_8_ = 0;
  local_5c8._32_8_ = (__pthread_internal_list *)0x0;
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)local_5c8);
  if (iVar1 == 0) {
    local_618.user_comparator_ = BytewiseComparator();
    local_618.super_Comparator._vptr_Comparator = (_func_int **)&PTR__Comparator_0015c0c8;
    Options::Options(&local_f0);
    VersionSet::VersionSet
              ((VersionSet *)local_340,&local_638,&local_f0,(TableCache *)0x0,&local_618);
    local_4e8[0] = true;
    local_4e8._8_8_ =
         "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_test.cc";
    local_4e8._16_4_ = 0x8e4;
    std::__cxx11::stringstream::stringstream(local_4d0);
    VersionSet::Recover((VersionSet *)&local_590[0].__data,(bool *)local_340);
    test::Tester::IsOk((Tester *)local_4e8,(Status *)&local_590[0].__data);
    if ((void *)local_590[0]._0_8_ != (void *)0x0) {
      operator_delete__((void *)local_590[0]._0_8_);
    }
    test::Tester::~Tester((Tester *)local_4e8);
    VersionEdit::VersionEdit((VersionEdit *)&local_590[0].__data);
    file = (pointer)0x1;
    local_648 = (ulong)(uint)num_base_files;
    if (0 < num_base_files) {
      uVar6 = 2;
      uVar5 = extraout_RDX;
      do {
        MakeKey_abi_cxx11_((string *)local_6a0,(leveldb *)(ulong)uVar6,(uint)uVar5);
        local_678._M_dataplus._M_p = (pointer)CONCAT44(local_6a0._4_4_,local_6a0._0_4_);
        local_678._M_string_length = local_6a0._8_8_;
        InternalKey::InternalKey((InternalKey *)local_4e8,(Slice *)&local_678,1,kTypeValue);
        uVar4 = extraout_EDX;
        if ((undefined1 *)CONCAT44(local_6a0._4_4_,local_6a0._0_4_) != local_6a0 + 0x10) {
          operator_delete((undefined1 *)CONCAT44(local_6a0._4_4_,local_6a0._0_4_));
          uVar4 = extraout_EDX_00;
        }
        MakeKey_abi_cxx11_(&local_678,(leveldb *)(ulong)(uVar6 + 1),uVar4);
        local_608._0_8_ = local_678._M_dataplus._M_p;
        local_608._8_8_ = local_678._M_string_length;
        InternalKey::InternalKey((InternalKey *)local_6a0,(Slice *)local_608,1,kTypeDeletion);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_678._M_dataplus._M_p != &local_678.field_2) {
          operator_delete(local_678._M_dataplus._M_p);
        }
        VersionEdit::AddFile
                  ((VersionEdit *)&local_590[0].__data,2,(uint64_t)file,1,(InternalKey *)local_4e8,
                   (InternalKey *)local_6a0);
        uVar5 = extraout_RDX_00;
        if ((undefined1 *)CONCAT44(local_6a0._4_4_,local_6a0._0_4_) != local_6a0 + 0x10) {
          operator_delete((undefined1 *)CONCAT44(local_6a0._4_4_,local_6a0._0_4_));
          uVar5 = extraout_RDX_01;
        }
        if ((undefined1 *)CONCAT71(local_4e8._1_7_,local_4e8[0]) != local_4e8 + 0x10) {
          operator_delete((undefined1 *)CONCAT71(local_4e8._1_7_,local_4e8[0]));
          uVar5 = extraout_RDX_02;
        }
        file = (pointer)((long)file + 1);
        uVar6 = uVar6 + 2;
      } while ((pointer)(ulong)(num_base_files + 1) != file);
    }
    local_4e8[0] = true;
    local_4e8._8_8_ =
         "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_test.cc";
    local_4e8._16_4_ = 0x8ec;
    std::__cxx11::stringstream::stringstream(local_4d0);
    VersionSet::LogAndApply
              ((VersionSet *)local_6a0,(VersionEdit *)local_340,(Mutex *)&local_590[0].__data);
    test::Tester::IsOk((Tester *)local_4e8,(Status *)local_6a0);
    if ((void *)CONCAT44(local_6a0._4_4_,local_6a0._0_4_) != (void *)0x0) {
      operator_delete__((void *)CONCAT44(local_6a0._4_4_,local_6a0._0_4_));
    }
    test::Tester::~Tester((Tester *)local_4e8);
    iVar1 = (*local_640->_vptr_Env[0x13])();
    local_5e8 = (pointer)CONCAT44(extraout_var,iVar1);
    if (0 < (int)local_658) {
      local_5e0 = (pointer)(ulong)(uint)((int)local_658 + (int)file);
      uVar6 = (int)file * 2;
      do {
        VersionEdit::VersionEdit((VersionEdit *)local_4e8);
        local_6a0._0_4_ = 2;
        local_6a0._8_8_ = file;
        pVar7 = std::
                _Rb_tree<std::pair<int,unsigned_long>,std::pair<int,unsigned_long>,std::_Identity<std::pair<int,unsigned_long>>,std::less<std::pair<int,unsigned_long>>,std::allocator<std::pair<int,unsigned_long>>>
                ::_M_insert_unique<std::pair<int,unsigned_long>>
                          (local_488,(pair<int,_unsigned_long> *)local_6a0);
        MakeKey_abi_cxx11_(&local_678,(leveldb *)(ulong)uVar6,pVar7._8_4_);
        local_608._0_8_ = local_678._M_dataplus._M_p;
        local_608._8_8_ = local_678._M_string_length;
        InternalKey::InternalKey((InternalKey *)local_6a0,(Slice *)local_608,1,kTypeValue);
        uVar4 = extraout_EDX_01;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_678._M_dataplus._M_p != &local_678.field_2) {
          operator_delete(local_678._M_dataplus._M_p);
          uVar4 = extraout_EDX_02;
        }
        MakeKey_abi_cxx11_((string *)local_608,(leveldb *)(ulong)(uVar6 + 1),uVar4);
        local_5a0.data_ = (char *)local_608._0_8_;
        local_5a0.size_ = local_608._8_8_;
        InternalKey::InternalKey((InternalKey *)&local_678,&local_5a0,1,kTypeDeletion);
        if ((undefined1 *)local_608._0_8_ != local_608 + 0x10) {
          operator_delete((void *)local_608._0_8_);
        }
        VersionEdit::AddFile
                  ((VersionEdit *)local_4e8,2,(uint64_t)file,1,(InternalKey *)local_6a0,
                   (InternalKey *)&local_678);
        VersionSet::LogAndApply((VersionSet *)local_5d8,(VersionEdit *)local_340,(Mutex *)local_4e8)
        ;
        if (local_5d8 != (undefined1  [8])0x0) {
          operator_delete__((void *)local_5d8);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_678._M_dataplus._M_p != &local_678.field_2) {
          operator_delete(local_678._M_dataplus._M_p);
        }
        if ((undefined1 *)CONCAT44(local_6a0._4_4_,local_6a0._0_4_) != local_6a0 + 0x10) {
          operator_delete((undefined1 *)CONCAT44(local_6a0._4_4_,local_6a0._0_4_));
        }
        file = (pointer)((long)file + 1);
        VersionEdit::~VersionEdit((VersionEdit *)local_4e8);
        uVar6 = uVar6 + 2;
      } while (local_5e0 != file);
    }
    iVar1 = (*local_640->_vptr_Env[0x13])();
    uVar6 = iVar1 - (int)local_5e8;
    snprintf(local_4e8,0x10,"%d",local_648);
    fprintf(_stderr,"BM_LogAndApply/%-6s   %8d iters : %9u us (%7.0f us / iter)\n",
            SUB84((double)((float)uVar6 / (float)(int)local_658),0),local_4e8,local_658,(ulong)uVar6
           );
    VersionEdit::~VersionEdit((VersionEdit *)&local_590[0].__data);
    VersionSet::~VersionSet((VersionSet *)local_340);
    Comparator::~Comparator(&local_618.super_Comparator);
    pthread_mutex_unlock((pthread_mutex_t *)local_5c8);
    if (local_650._vptr_DB != (_func_int **)0x0) {
      operator_delete__(local_650._vptr_DB);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_638._M_dataplus._M_p != &local_638.field_2) {
      operator_delete(local_638._M_dataplus._M_p);
    }
    return;
  }
  std::__throw_system_error(iVar1);
}

Assistant:

void BM_LogAndApply(int iters, int num_base_files) {
  std::string dbname = test::TmpDir() + "/leveldb_test_benchmark";
  DestroyDB(dbname, Options());

  DB* db = nullptr;
  Options opts;
  opts.create_if_missing = true;
  Status s = DB::Open(opts, dbname, &db);
  ASSERT_OK(s);
  ASSERT_TRUE(db != nullptr);

  delete db;
  db = nullptr;

  Env* env = Env::Default();

  port::Mutex mu;
  MutexLock l(&mu);

  InternalKeyComparator cmp(BytewiseComparator());
  Options options;
  VersionSet vset(dbname, &options, nullptr, &cmp);
  bool save_manifest;
  ASSERT_OK(vset.Recover(&save_manifest));
  VersionEdit vbase;
  uint64_t fnum = 1;
  for (int i = 0; i < num_base_files; i++) {
    InternalKey start(MakeKey(2 * fnum), 1, kTypeValue);
    InternalKey limit(MakeKey(2 * fnum + 1), 1, kTypeDeletion);
    vbase.AddFile(2, fnum++, 1 /* file size */, start, limit);
  }
  ASSERT_OK(vset.LogAndApply(&vbase, &mu));

  uint64_t start_micros = env->NowMicros();

  for (int i = 0; i < iters; i++) {
    VersionEdit vedit;
    vedit.DeleteFile(2, fnum);
    InternalKey start(MakeKey(2 * fnum), 1, kTypeValue);
    InternalKey limit(MakeKey(2 * fnum + 1), 1, kTypeDeletion);
    vedit.AddFile(2, fnum++, 1 /* file size */, start, limit);
    vset.LogAndApply(&vedit, &mu);
  }
  uint64_t stop_micros = env->NowMicros();
  unsigned int us = stop_micros - start_micros;
  char buf[16];
  snprintf(buf, sizeof(buf), "%d", num_base_files);
  fprintf(stderr,
          "BM_LogAndApply/%-6s   %8d iters : %9u us (%7.0f us / iter)\n", buf,
          iters, us, ((float)us) / iters);
}